

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notify_next.c
# Opt level: O0

mpt_input * mpt_notify_next(mpt_notify *no)

{
  mpt_buffer *pmVar1;
  _mpt_vptr_buffer *p_Var2;
  mpt_input *pmVar3;
  mpt_input *curr;
  size_t i;
  void **first;
  size_t len;
  mpt_buffer *s;
  mpt_notify *no_local;
  
  pmVar1 = (no->_wait)._buf;
  if ((pmVar1 != (mpt_buffer *)0x0) &&
     (pmVar3 = (mpt_input *)(pmVar1->_used >> 3), pmVar3 != (mpt_input *)0x0)) {
    for (curr = (mpt_input *)0x0; curr < pmVar3; curr = (mpt_input *)((long)&curr->_vptr + 1)) {
      p_Var2 = (&pmVar1[1]._vptr)[(long)curr];
      if (p_Var2 != (_mpt_vptr_buffer *)0x0) {
        (&pmVar1[1]._vptr)[(long)curr] = (_mpt_vptr_buffer *)0x0;
        return (mpt_input *)p_Var2;
      }
    }
    pmVar1->_used = 0;
  }
  return (mpt_input *)0x0;
}

Assistant:

extern MPT_INTERFACE(input) *mpt_notify_next(const MPT_STRUCT(notify) *no)
{
	MPT_STRUCT(buffer) *s;
	size_t len;
	
	if ((s = no->_wait._buf) && (len = s->_used / sizeof(void *))) {
		void **first = (void *) (s+1);
		size_t i;
		
		for (i = 0; i < len; i++) {
			MPT_INTERFACE(input) *curr;
			if (!(curr = first[i])) continue;
			first[i] = 0;
			return curr;
		}
		s->_used = 0;
	}
	return 0;
}